

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mbedtls_mpi_uint mVar8;
  long lVar9;
  ulong uVar10;
  char *__dest;
  ulong local_90;
  mbedtls_mpi_uint r;
  size_t local_80;
  ulong local_78;
  size_t *local_70;
  undefined1 local_68 [8];
  mbedtls_mpi B;
  undefined1 local_40 [8];
  mbedtls_mpi T;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  sVar4 = mbedtls_mpi_core_bitlen(X->p,(ulong)X->n);
  uVar5 = (sVar4 >> (3U < (uint)radix)) >> (0xfU < (uint)radix);
  uVar5 = uVar5 + ((int)uVar5 + 3U & 1) + 3;
  if (buflen < uVar5) {
    *olen = uVar5;
    return -8;
  }
  T.p._0_4_ = 1;
  local_40 = (undefined1  [8])0x0;
  __dest = buf;
  if (X->s == -1) {
    *buf = '-';
    buflen = buflen - 1;
    __dest = buf + 1;
  }
  local_70 = olen;
  if (radix == 0x10) {
    uVar5 = (ulong)X->n;
    if (uVar5 != 0) {
      uVar7 = (ulong)((uint)X->n * 8);
      bVar2 = false;
      do {
        lVar9 = 0x30;
        do {
          uVar10 = X->p[uVar5 - 1] >> ((char)lVar9 + 8U & 0x3f);
          uVar6 = uVar10 & 0xff;
          if (((uVar7 + lVar9 == 0) || ((int)uVar6 != 0)) || (bVar2)) {
            *__dest = "0123456789ABCDEF"[uVar6 >> 4];
            __dest[1] = "0123456789ABCDEF"[(uint)uVar10 & 0xf];
            __dest = __dest + 2;
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          lVar9 = lVar9 + -8;
        } while (lVar9 != -0x10);
        uVar7 = uVar7 - 8;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  else {
    iVar3 = mbedtls_mpi_copy((mbedtls_mpi *)local_40,X);
    if (iVar3 != 0) goto LAB_0021ba46;
    if ((short)T.p == -1) {
      T.p._0_2_ = 1;
    }
    mVar8 = 0;
    local_80 = buflen;
    local_78 = (ulong)(uint)radix;
    do {
      uVar5 = local_78;
      if (local_80 + mVar8 == 0) {
        iVar3 = -8;
        goto LAB_0021ba46;
      }
      r = mVar8;
      iVar3 = mbedtls_mpi_mod_int(&local_90,(mbedtls_mpi *)local_40,local_78);
      if (iVar3 != 0) goto LAB_0021ba46;
      B.p._0_4_ = 0x10001;
      local_68 = (undefined1  [8])&B.s;
      B._8_8_ = uVar5;
      iVar3 = mbedtls_mpi_div_mpi((mbedtls_mpi *)local_40,(mbedtls_mpi *)0x0,(mbedtls_mpi *)local_40
                                  ,(mbedtls_mpi *)local_68);
      mVar8 = r;
      if (iVar3 != 0) goto LAB_0021ba46;
      bVar1 = (byte)local_90 + 0x37;
      if (local_90 < 10) {
        bVar1 = (byte)local_90 | 0x30;
      }
      __dest[r + (buflen - 1)] = bVar1;
      B.s = 0;
      B.n = 0;
      B._12_4_ = 0;
      B.p._0_4_ = 0x10001;
      local_68 = (undefined1  [8])&B.s;
      iVar3 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_40,(mbedtls_mpi *)local_68);
      mVar8 = mVar8 - 1;
    } while (iVar3 != 0);
    memmove(__dest,__dest + mVar8 + buflen,-mVar8);
    __dest = __dest + -mVar8;
  }
  *__dest = '\0';
  *local_70 = (size_t)(__dest + (1 - (long)buf));
  iVar3 = 0;
LAB_0021ba46:
  if (local_40 != (undefined1  [8])0x0) {
    mbedtls_zeroize_and_free((void *)local_40,(ulong)T.p._2_2_ << 3);
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_write_string(const mbedtls_mpi *X, int radix,
                             char *buf, size_t buflen, size_t *olen)
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;
    MPI_VALIDATE_RET(X    != NULL);
    MPI_VALIDATE_RET(olen != NULL);
    MPI_VALIDATE_RET(buflen == 0 || buf != NULL);

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    n = mbedtls_mpi_bitlen(X);   /* Number of bits necessary to present `n`. */
    if (radix >=  4) {
        n >>= 1;                 /* Number of 4-adic digits necessary to present
                                  * `n`. If radix > 4, this might be a strict
                                  * overapproximation of the number of
                                  * radix-adic digits needed to present `n`. */
    }
    if (radix >= 16) {
        n >>= 1;                 /* Number of hexadecimal digits necessary to
                                  * present `n`. */

    }
    n += 1; /* Terminating null byte */
    n += 1; /* Compensate for the divisions above, which round down `n`
             * in case it's not even. */
    n += 1; /* Potential '-'-sign. */
    n += (n & 1);   /* Make n even to have enough space for hexadecimal writing,
                     * which always uses an even number of hex-digits. */

    if (buflen < n) {
        *olen = n;
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    p = buf;
    mbedtls_mpi_init(&T);

    if (X->s == -1) {
        *p++ = '-';
        buflen--;
    }

    if (radix == 16) {
        int c;
        size_t i, j, k;

        for (i = X->n, k = 0; i > 0; i--) {
            for (j = ciL; j > 0; j--) {
                c = (X->p[i - 1] >> ((j - 1) << 3)) & 0xFF;

                if (c == 0 && k == 0 && (i + j) != 2) {
                    continue;
                }

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&T, X));

        if (T.s == -1) {
            T.s = 1;
        }

        MBEDTLS_MPI_CHK(mpi_write_hlp(&T, radix, &p, buflen));
    }

    *p++ = '\0';
    *olen = p - buf;

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}